

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getMediaBox(QPDFPageObjectHelper *this,bool copy_if_shared)

{
  byte in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  QPDFObjectHandle QVar1;
  allocator<char> local_41;
  string local_40 [39];
  byte local_19;
  string *psStack_18;
  bool copy_if_shared_local;
  QPDFPageObjectHelper *this_local;
  
  local_19 = in_DL & 1;
  psStack_18 = (string *)CONCAT71(in_register_00000031,copy_if_shared);
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/MediaBox",&local_41);
  getAttribute(this,(string *)CONCAT71(in_register_00000031,copy_if_shared),SUB81(local_40,0));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getMediaBox(bool copy_if_shared)
{
    return getAttribute("/MediaBox", copy_if_shared);
}